

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
 __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::insertKeyPrepareEmptySpot<std::__cxx11::string&>
          (Table<true,80ul,std::__cxx11::string,int,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  pointer __s1;
  size_t __n;
  bool bVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  size_t *psVar12;
  long lVar13;
  ulong uVar14;
  ulong insertion_idx;
  uint uVar15;
  pair<unsigned_long,_robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::InsertionState>
  pVar16;
  
  iVar7 = 0;
  while( true ) {
    sVar8 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,key);
    lVar13 = *(long *)(this + 0x10);
    iVar4 = *(int *)(this + 0x30);
    uVar14 = sVar8 * *(long *)this >> 0x21 ^ sVar8 * *(long *)this;
    insertion_idx = uVar14 >> 5 & *(ulong *)(this + 0x20);
    uVar15 = ((uint)uVar14 & 0x1f) >> ((ulong)(byte)this[0x34] & 0x3f);
    bVar3 = *(byte *)(lVar13 + insertion_idx);
    while( true ) {
      uVar15 = uVar15 + iVar4;
      if (bVar3 <= uVar15) break;
      bVar3 = *(byte *)(lVar13 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar15 == bVar3) {
      __s1 = (key->_M_dataplus)._M_p;
      __n = key->_M_string_length;
      psVar12 = (size_t *)(*(long *)(this + 8) + 8 + insertion_idx * 0x28);
      do {
        if (__n == *psVar12) {
          uVar11 = 1;
          if (__n == 0) goto LAB_0012be9f;
          iVar6 = bcmp(__s1,(void *)psVar12[-1],__n);
          if (iVar6 == 0) {
            uVar11 = 1;
            goto LAB_0012be9f;
          }
        }
        pbVar2 = (byte *)(lVar13 + 1 + insertion_idx);
        uVar15 = uVar15 + iVar4;
        insertion_idx = insertion_idx + 1;
        psVar12 = psVar12 + 5;
      } while (uVar15 == *pbVar2);
    }
    if (*(ulong *)(this + 0x18) < *(ulong *)(this + 0x28)) break;
    bVar5 = Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)this);
    insertion_idx = 0;
    if (!bVar5) {
      uVar11 = 0;
      goto LAB_0012be9f;
    }
    iVar7 = iVar7 + 1;
    uVar11 = 0;
    if (iVar7 == 0x100) goto LAB_0012be9f;
  }
  if (0xff < iVar4 + uVar15) {
    *(undefined8 *)(this + 0x28) = 0;
  }
  lVar9 = 1;
  lVar10 = lVar13;
  do {
    lVar9 = lVar9 + -1;
    pcVar1 = (char *)(lVar10 + insertion_idx);
    lVar10 = lVar10 + 1;
  } while (*pcVar1 != '\0');
  if (lVar9 == 0) {
    uVar11 = 2;
  }
  else {
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,insertion_idx - lVar9,insertion_idx);
    lVar13 = *(long *)(this + 0x10);
    uVar11 = 3;
  }
  *(char *)(lVar13 + insertion_idx) = (char)uVar15;
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
LAB_0012be9f:
  pVar16._8_8_ = uVar11;
  pVar16.first = insertion_idx;
  return pVar16;
}

Assistant:

std::pair<size_t, InsertionState> insertKeyPrepareEmptySpot(OtherKey&& key) {
        for (int i = 0; i < 256; ++i) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair(idx, InsertionState::key_found);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                if (!increase_size()) {
                    return std::make_pair(size_t(0), InsertionState::overflow_error);
                }
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            if (idx != insertion_idx) {
                shiftUp(idx, insertion_idx);
            }
            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);
            ++mNumElements;
            return std::make_pair(insertion_idx, idx == insertion_idx
                                                     ? InsertionState::new_node
                                                     : InsertionState::overwrite_node);
        }

        // enough attempts failed, so finally give up.
        return std::make_pair(size_t(0), InsertionState::overflow_error);
    }